

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O2

void __thiscall
ezc3d::ParametersNS::GroupNS::Parameter::set
          (Parameter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data,vector<unsigned_long,_std::allocator<unsigned_long>_> *dimension)

{
  pointer pbVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  range_error *this_00;
  uint uVar5;
  Parameter *this_01;
  size_t dataSize;
  size_t first_dim;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensionCopy;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensionWithStrLen;
  
  dimensionCopy.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dimensionCopy.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dimensionCopy.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((dimension->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (dimension->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    dimensionWithStrLen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)(data->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(data->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5);
    this_01 = (Parameter *)&dimensionCopy;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,
               (unsigned_long *)&dimensionWithStrLen);
  }
  else {
    this_01 = (Parameter *)&dimensionCopy;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,dimension);
  }
  pbVar1 = (data->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  dataSize = (long)(data->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  bVar3 = isDimensionConsistent(this_01,dataSize,&dimensionCopy);
  if (bVar3) {
    first_dim = 0;
    uVar4 = 0;
    for (uVar5 = 0; uVar5 < dataSize; uVar5 = uVar5 + 1) {
      uVar2 = pbVar1[uVar5]._M_string_length;
      if (uVar4 < uVar2) {
        uVar4 = uVar2;
        first_dim = uVar2;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&dimensionWithStrLen,&dimensionCopy);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
              (&dimensionWithStrLen,
               (const_iterator)
               dimensionWithStrLen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start,&first_dim);
    this->_data_type = CHAR;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->_param_data_string,data);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&this->_dimension,&dimensionWithStrLen);
    setEmptyFlag(this);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&dimensionWithStrLen.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&dimensionCopy.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    return;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error
            (this_00,"Dimension of the data does not correspond to sent dimensions");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void ezc3d::ParametersNS::GroupNS::Parameter::set(
    const std::vector<std::string> &data,
    const std::vector<size_t> &dimension) {
  std::vector<size_t> dimensionCopy;
  if (dimension.size() == 0) {
    dimensionCopy.push_back(data.size());
  } else {
    dimensionCopy = dimension;
  }
  if (!isDimensionConsistent(data.size(), dimensionCopy))
    throw std::range_error(
        "Dimension of the data does not correspond to sent dimensions");
  // Insert the length of the longest string
  size_t first_dim(0);
  for (unsigned int i = 0; i < data.size(); ++i)
    if (data[i].size() > first_dim)
      first_dim = data[i].size();
  std::vector<size_t> dimensionWithStrLen = dimensionCopy;
  dimensionWithStrLen.insert(dimensionWithStrLen.begin(), first_dim);

  _data_type = ezc3d::DATA_TYPE::CHAR;
  _param_data_string = data;
  _dimension = dimensionWithStrLen;
  setEmptyFlag();
}